

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Ranged_For_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Ranged_For_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  bool bVar1;
  const_reference pvVar2;
  pointer pAVar3;
  string *t_name;
  Type_Info *pTVar4;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar5;
  Break_Loop *anon_var_0;
  Continue_Loop *anon_var_0_1;
  Boxed_Value local_188;
  Scope_Push_Pop local_178;
  Scope_Push_Pop spp;
  undefined1 local_160 [8];
  Boxed_Value range_obj;
  atomic<unsigned_long> local_148 [4];
  undefined1 local_128 [8];
  type pop_front_funcs;
  atomic<unsigned_long> local_110 [4];
  undefined1 local_f0 [8];
  type front_funcs;
  atomic<unsigned_long> local_d8 [4];
  undefined1 local_b8 [8];
  type empty_funcs;
  atomic<unsigned_long> local_a0 [4];
  undefined1 local_80 [8];
  type range_funcs;
  undefined1 local_60 [8];
  anon_class_24_3_0ad2d99a do_loop;
  Boxed_Value range_expression_result;
  string *loop_var_name;
  anon_class_8_1_8991db09 call_function;
  anon_class_8_1_8991db09 get_function;
  Dispatch_State *t_ss_local;
  Ranged_For_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this_local;
  
  pvVar2 = Catch::clara::std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,0);
  pAVar3 = Catch::clara::std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
           ::operator->(pvVar2);
  t_name = &(pAVar3->super_AST_Node).text;
  pvVar2 = Catch::clara::std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,1);
  pAVar3 = Catch::clara::std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
           ::operator->(pvVar2);
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)&do_loop.this,
             (Dispatch_State *)pAVar3);
  local_60 = (undefined1  [8])t_name;
  do_loop.t_ss = t_ss;
  pTVar4 = Boxed_Value::get_type_info((Boxed_Value *)&do_loop.this);
  bVar1 = Type_Info::bare_equal_type_info
                    (pTVar4,(type_info *)
                            &std::
                             vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>
                             ::typeinfo);
  if (bVar1) {
    boxed_cast<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&>
              ((Boxed_Value *)&do_loop.this,(Type_Conversions_State *)0x0);
    const::{lambda(auto:1_const&)#1}::operator()
              ((_lambda_auto_1_const___1_ *)this,
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_60
              );
    range_funcs.
    super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 1;
  }
  else {
    pTVar4 = Boxed_Value::get_type_info((Boxed_Value *)&do_loop.this);
    bVar1 = Type_Info::bare_equal_type_info
                      (pTVar4,(type_info *)
                              &std::
                               map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                               ::typeinfo);
    if (bVar1) {
      boxed_cast<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>const&>
                ((Boxed_Value *)&do_loop.this,(Type_Conversions_State *)0x0);
      const::{lambda(auto:1_const&)#1}::operator()
                ((_lambda_auto_1_const___1_ *)this,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                  *)local_60);
      range_funcs.
      super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,"range",
                 (allocator<char> *)
                 ((long)&empty_funcs.
                         super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      const::{lambda(std::__cxx11::string_const&,auto:1&)#1}::operator()
                (local_80,(string *)&call_function,local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&empty_funcs.
                         super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d8,"empty",
                 (allocator<char> *)
                 ((long)&front_funcs.
                         super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      const::{lambda(std::__cxx11::string_const&,auto:1&)#1}::operator()
                (local_b8,(string *)&call_function,local_d8);
      std::__cxx11::string::~string((string *)local_d8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&front_funcs.
                         super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_110,"front",
                 (allocator<char> *)
                 ((long)&pop_front_funcs.
                         super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      const::{lambda(std::__cxx11::string_const&,auto:1&)#1}::operator()
                (local_f0,(string *)&call_function,local_110);
      std::__cxx11::string::~string((string *)local_110);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&pop_front_funcs.
                         super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_148,"pop_front",
                 (allocator<char> *)
                 ((long)&range_obj.m_data.
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      const::{lambda(std::__cxx11::string_const&,auto:1&)#1}::operator()
                (local_128,(string *)&call_function,local_148);
      std::__cxx11::string::~string((string *)local_148);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&range_obj.m_data.
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      const::{lambda(auto:1_const&,chaiscript::Boxed_Value_const&)#1}::operator()
                (local_160,
                 (shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                  *)&loop_var_name,(Boxed_Value *)local_80);
      while( true ) {
        const::{lambda(auto:1_const&,chaiscript::Boxed_Value_const&)#1}::operator()
                  (&spp,(shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                         *)&loop_var_name,(Boxed_Value *)local_b8);
        bVar1 = boxed_cast<bool>((Boxed_Value *)&spp,(Type_Conversions_State *)0x0);
        Boxed_Value::~Boxed_Value((Boxed_Value *)&spp);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        detail::Scope_Push_Pop::Scope_Push_Pop(&local_178,in_RDX);
        const::{lambda(auto:1_const&,chaiscript::Boxed_Value_const&)#1}::operator()
                  (&local_188,
                   (shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                    *)&loop_var_name,(Boxed_Value *)local_f0);
        chaiscript::detail::Dispatch_State::add_get_object(in_RDX,t_name,&local_188);
        Boxed_Value::~Boxed_Value(&local_188);
        pvVar2 = Catch::clara::std::
                 vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                 ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                               *)&t_ss[2].m_conversions,2);
        pAVar3 = Catch::clara::std::
                 unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
                 ::operator->(pvVar2);
        AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)&anon_var_0_1,
                   (Dispatch_State *)pAVar3);
        Boxed_Value::~Boxed_Value((Boxed_Value *)&anon_var_0_1);
        const::{lambda(auto:1_const&,chaiscript::Boxed_Value_const&)#1}::operator()
                  (&anon_var_0,
                   (shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                    *)&loop_var_name,(Boxed_Value *)local_128);
        Boxed_Value::~Boxed_Value((Boxed_Value *)&anon_var_0);
        detail::Scope_Push_Pop::~Scope_Push_Pop(&local_178);
      }
      Boxed_Value::~Boxed_Value((Boxed_Value *)local_160);
      void_var();
      range_funcs.
      super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 1;
      Catch::clara::std::
      shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
      ::~shared_ptr((shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                     *)local_128);
      Catch::clara::std::
      shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
      ::~shared_ptr((shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                     *)local_f0);
      Catch::clara::std::
      shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
      ::~shared_ptr((shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                     *)local_b8);
      Catch::clara::std::
      shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
      ::~shared_ptr((shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                     *)local_80);
    }
  }
  Boxed_Value::~Boxed_Value((Boxed_Value *)&do_loop.this);
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        const auto get_function = [&t_ss](const std::string &t_name, auto &t_hint) {
          uint_fast32_t hint = t_hint;
          auto [funs_loc, funs] = t_ss->get_function(t_name, hint);
          if (funs_loc != hint) {
            t_hint = uint_fast32_t(funs_loc);
          }
          return std::move(funs);
        };

        const auto call_function = [&t_ss](const auto &t_funcs, const Boxed_Value &t_param) {
          return dispatch::dispatch(*t_funcs, Function_Params{t_param}, t_ss.conversions());
        };

        const std::string &loop_var_name = this->children[0]->text;
        Boxed_Value range_expression_result = this->children[1]->eval(t_ss);

        const auto do_loop = [&loop_var_name, &t_ss, this](const auto &ranged_thing) {
          try {
            for (auto &&loop_var : ranged_thing) {
              // This scope push and pop might not be the best thing for perf
              // but we know it's 100% correct
              chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);
              /// to-do make this if-constexpr with C++17 branch
              if (!std::is_same<std::decay_t<decltype(loop_var)>, Boxed_Value>::value) {
                t_ss.add_get_object(loop_var_name, Boxed_Value(std::ref(loop_var)));
              } else {
                t_ss.add_get_object(loop_var_name, Boxed_Value(loop_var));
              }
              try {
                this->children[2]->eval(t_ss);
              } catch (detail::Continue_Loop &) {
              }
            }
          } catch (detail::Break_Loop &) {
            // loop broken
          }
          return void_var();
        };

        if (range_expression_result.get_type_info().bare_equal_type_info(typeid(std::vector<Boxed_Value>))) {
          return do_loop(boxed_cast<const std::vector<Boxed_Value> &>(range_expression_result));
        } else if (range_expression_result.get_type_info().bare_equal_type_info(typeid(std::map<std::string, Boxed_Value>))) {
          return do_loop(boxed_cast<const std::map<std::string, Boxed_Value> &>(range_expression_result));
        } else {
          const auto range_funcs = get_function("range", m_range_loc);
          const auto empty_funcs = get_function("empty", m_empty_loc);
          const auto front_funcs = get_function("front", m_front_loc);
          const auto pop_front_funcs = get_function("pop_front", m_pop_front_loc);

          try {
            const auto range_obj = call_function(range_funcs, range_expression_result);
            while (!boxed_cast<bool>(call_function(empty_funcs, range_obj))) {
              chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);
              t_ss.add_get_object(loop_var_name, call_function(front_funcs, range_obj));
              try {
                this->children[2]->eval(t_ss);
              } catch (detail::Continue_Loop &) {
                // continue statement hit
              }
              call_function(pop_front_funcs, range_obj);
            }
          } catch (detail::Break_Loop &) {
            // loop broken
          }
          return void_var();
        }
      }